

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseTypeModuleField(WastParser *this,Module *module)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  pointer pFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_> local_138;
  Enum local_12c;
  Enum local_128;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_124;
  undefined1 local_123;
  allocator local_122;
  allocator local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8 [32];
  iterator local_d8;
  size_type local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  Enum local_b0;
  Enum local_ac;
  undefined1 local_a8 [8];
  BindingHash bindings;
  Location local_50;
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_> local_30;
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_> field;
  Module *module_local;
  WastParser *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
  .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl._4_4_ = Expect(this,Lpar);
  bVar1 = Failed(field._M_t.
                 super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
                 .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation(&local_50,this);
    MakeUnique<wabt::FuncTypeModuleField,wabt::Location>((wabt *)&local_30,&local_50);
    result = Expect(this,Last_Bare);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pFVar2 = std::
               unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
               ::operator->(&local_30);
      ParseBindVarOpt(this,&(pFVar2->func_type).name);
      bindings.
      super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      ._M_h._M_single_bucket._4_4_ = Expect(this,Lpar);
      bVar1 = Failed(bindings.
                     super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                     ._M_h._M_single_bucket._4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        bindings.
        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
        ._M_h._M_single_bucket._0_4_ = Expect(this,Func);
        bVar1 = Failed(bindings.
                       super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                       ._M_h._M_single_bucket._0_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          BindingHash::BindingHash((BindingHash *)local_a8);
          pFVar2 = std::
                   unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                   ::operator->(&local_30);
          local_ac = (Enum)ParseFuncSignature(this,&(pFVar2->func_type).sig,(BindingHash *)local_a8)
          ;
          bVar1 = Failed((Result)local_ac);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            local_123 = 1;
            local_120 = &local_118;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_118,"param",&local_121);
            local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_f8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f8,"result",&local_122);
            local_123 = 0;
            local_d8 = &local_118;
            local_d0 = 2;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator(&local_124);
            __l._M_len = local_d0;
            __l._M_array = local_d8;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_c8,__l,&local_124);
            local_b0 = (Enum)ErrorIfLpar(this,&local_c8,(char *)0x0);
            bVar1 = Failed((Result)local_b0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_c8);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator(&local_124);
            local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_d8;
            do {
              local_198 = local_198 + -1;
              std::__cxx11::string::~string((string *)local_198);
            } while (local_198 != &local_118);
            std::allocator<char>::~allocator((allocator<char> *)&local_122);
            std::allocator<char>::~allocator((allocator<char> *)&local_121);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
            }
            else {
              local_128 = (Enum)Expect(this,Rpar);
              bVar1 = Failed((Result)local_128);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
              }
              else {
                local_12c = (Enum)Expect(this,Rpar);
                bVar1 = Failed((Result)local_12c);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                }
                else {
                  std::
                  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                  ::unique_ptr(&local_138,&local_30);
                  Module::AppendField(module,&local_138);
                  std::
                  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                  ::~unique_ptr(&local_138);
                  Result::Result((Result *)((long)&this_local + 4),Ok);
                }
              }
            }
          }
          BindingHash::~BindingHash((BindingHash *)local_a8);
        }
      }
    }
    std::unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>::
    ~unique_ptr(&local_30);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseTypeModuleField(Module* module) {
  WABT_TRACE(ParseTypeModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<FuncTypeModuleField>(GetLocation());
  EXPECT(Type);
  ParseBindVarOpt(&field->func_type.name);
  EXPECT(Lpar);
  EXPECT(Func);
  BindingHash bindings;
  CHECK_RESULT(ParseFuncSignature(&field->func_type.sig, &bindings));
  CHECK_RESULT(ErrorIfLpar({"param", "result"}));
  EXPECT(Rpar);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}